

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateCompileChunk(jx9_gen_state *pGen,sxi32 iFlags)

{
  uint uVar1;
  long lVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  SyToken *pSVar5;
  long lVar6;
  code *pcVar7;
  SyToken *pSVar8;
  
  pSVar8 = pGen->pIn;
  pSVar5 = pGen->pEnd;
  sVar4 = 0;
  do {
    if (pSVar5 <= pSVar8) {
      return sVar4;
    }
    if ((pSVar8->nType & 4) == 0) {
LAB_00121086:
      sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      sVar4 = -3;
      if (sVar3 != -3) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        sVar4 = sVar3;
        goto LAB_001210e2;
      }
    }
    else {
      uVar1 = *(uint *)&pSVar8->pUserData;
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        if (lVar6 + 0x10 == 0xf0) goto LAB_00121077;
        lVar2 = lVar6 + 0x10;
      } while (*(uint *)((long)&aLangConstruct[0].nID + lVar6) != uVar1);
      pcVar7 = *(code **)((long)&aLangConstruct[0].xConstruct + lVar6);
      if (pcVar7 == (code *)0x0) {
LAB_00121077:
        if ((uVar1 < 0x11) && ((0x1e004U >> (uVar1 & 0x1f) & 1) != 0)) goto LAB_00121086;
        sVar4 = jx9GenCompileError(pGen,1,pSVar8->nLine,"Syntax error: Unexpected keyword \'%z\'");
        pcVar7 = jx9ErrorRecover;
        if (sVar4 == -10) {
          return -10;
        }
      }
      sVar4 = (*pcVar7)(pGen);
LAB_001210e2:
      if (sVar4 == -10) {
        return -10;
      }
    }
    pSVar5 = pGen->pEnd;
    pSVar8 = pGen->pIn;
    while ((pSVar8 < pSVar5 && ((pSVar8->nType & 0x40000) != 0))) {
      pGen->pIn = pSVar8 + 1;
      pSVar8 = pSVar8 + 1;
    }
    if ((iFlags & 1U) != 0) {
      return sVar4;
    }
  } while( true );
}

Assistant:

static sxi32 GenStateCompileChunk(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags             /* Compile flags */
	)
{
	ProcLangConstruct xCons;
	sxi32 rc;
	rc = SXRET_OK; /* Prevent compiler warning */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		xCons = 0;
		if( pGen->pIn->nType & JX9_TK_KEYWORD ){
			sxu32 nKeyword = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
			/* Try to extract a language construct handler */
			xCons = GenStateGetStatementHandler(nKeyword);
			if( xCons == 0 && !jx9IsLangConstruct(nKeyword) ){
				rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine,
					"Syntax error: Unexpected keyword '%z'",
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					break;
				}
				/* Synchronize with the first semi-colon and avoid compiling
				 * this erroneous statement.
				 */
				xCons = jx9ErrorRecover;
			}
		}
		if( xCons == 0 ){
			/* Assume an expression an try to compile it */
			rc = jx9CompileExpr(&(*pGen), 0, 0);
			if(  rc != SXERR_EMPTY ){
				/* Pop l-value */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
			}
		}else{
			/* Go compile the sucker */
			rc = xCons(&(*pGen));
		}
		if( rc == SXERR_ABORT ){
			/* Request to abort compilation */
			break;
		}
		/* Ignore trailing semi-colons ';' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
			pGen->pIn++;
		}
		if( iFlags & JX9_COMPILE_SINGLE_STMT ){
			/* Compile a single statement and return */
			break;
		}
		/* LOOP ONE */
		/* LOOP TWO */
		/* LOOP THREE */
		/* LOOP FOUR */
	}
	/* Return compilation status */
	return rc;
}